

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_init_copy(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_digit *pmVar2;
  
  pmVar2 = (mp_digit *)calloc(1,0x100);
  a->dp = pmVar2;
  if (pmVar2 != (mp_digit *)0x0) {
    a->used = 0;
    a->alloc = 0x20;
    a->sign = 0;
    iVar1 = mp_copy(b,a);
    return iVar1;
  }
  return -2;
}

Assistant:

int mp_init_copy (mp_int * a, mp_int * b)
{
  int     res;

  if ((res = mp_init (a)) != MP_OKAY) {
    return res;
  }
  return mp_copy (b, a);
}